

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O3

CURLcode glob_url(URLGlob **glob,char *url,unsigned_long *urlnum,FILE *error)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  byte *pbVar8;
  FILE *pFVar9;
  unsigned_long *puVar10;
  unsigned_long uVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  size_t sVar15;
  char *pcVar16;
  URLGlob *glob_00;
  char **ppcVar17;
  char *__dest;
  int *piVar18;
  byte *pbVar19;
  anon_union_40_3_e2f18bb4_for_content *paVar20;
  ulong uVar21;
  char **ppcVar22;
  byte *pbVar23;
  size_t sVar24;
  long lVar25;
  char cVar26;
  int iVar27;
  URLPattern *pUVar28;
  size_t sVar29;
  anon_union_40_3_e2f18bb4_for_content *paVar30;
  CURLcode CVar31;
  byte *pbVar32;
  byte *pbVar33;
  ulong uVar34;
  char max_c;
  char min_c;
  byte *local_290;
  char end_c;
  unsigned_long local_280;
  int local_274;
  byte *local_270;
  anon_union_40_3_e2f18bb4_for_content *local_268;
  FILE *local_260;
  unsigned_long *local_258;
  byte *local_250;
  URLPattern *local_248;
  URLGlob **local_240;
  char *endp;
  
  *glob = (URLGlob *)0x0;
  local_250 = (byte *)url;
  local_240 = glob;
  sVar15 = strlen(url);
  pcVar16 = (char *)malloc(sVar15 + 1);
  if (pcVar16 != (char *)0x0) {
    *pcVar16 = '\0';
    local_280 = 1;
    glob_00 = (URLGlob *)calloc(1,0x12f0);
    if (glob_00 != (URLGlob *)0x0) {
      glob_00->urllen = sVar15;
      glob_00->glob_buffer = pcVar16;
      pbVar33 = (byte *)0x1;
      CVar31 = CURLE_OK;
      local_274 = 0;
      pbVar23 = local_250;
      local_260 = error;
      local_258 = urlnum;
LAB_0011b84d:
      if ((CVar31 == CURLE_OK) && (*pbVar23 != 0)) {
        pbVar32 = (byte *)glob_00->glob_buffer;
        sVar15 = 0;
        local_290 = pbVar33;
LAB_0011b86e:
        for (; bVar12 = *pbVar23, bVar12 == 0x5b; pbVar23 = pbVar23 + sVar24) {
          uVar34 = 0;
          sVar24 = 1;
          do {
            while( true ) {
              do {
                sVar29 = sVar24 + 1;
                bVar12 = pbVar23[sVar24];
                iVar13 = Curl_isalnum((uint)bVar12);
                sVar24 = sVar29;
              } while (iVar13 != 0);
              if (bVar12 < 0x2e) break;
              if (bVar12 != 0x2e) {
                if (bVar12 != 0x3a) {
                  if (bVar12 == 0x5d) {
                    if (uVar34 < 2) goto LAB_0011b8be;
                    goto LAB_0011b8c9;
                  }
                  goto LAB_0011b8bb;
                }
                uVar34 = uVar34 + 1;
              }
            }
          } while (bVar12 == 0x25);
LAB_0011b8bb:
          sVar29 = 0;
LAB_0011b8be:
          sVar24 = 2;
          if (pbVar23[1] != 0x5d) {
LAB_0011b8c9:
            sVar24 = sVar29;
            if (sVar24 == 0) goto LAB_0011b961;
          }
          memcpy(pbVar32,pbVar23,sVar24);
          pbVar32 = pbVar32 + sVar24;
          sVar15 = sVar15 + sVar24;
        }
        if (bVar12 < 0x5d) {
          if (bVar12 == 0) goto LAB_0011b961;
          if (bVar12 == 0x5c) {
            pbVar33 = pbVar23 + 1;
            bVar12 = 0x5c;
            uVar14 = *pbVar33 - 0x5b;
            if ((uVar14 < 0x23) && ((0x500000005U >> ((ulong)uVar14 & 0x3f) & 1) != 0)) {
              pbVar23 = pbVar23 + 1;
              local_290 = local_290 + 1;
              bVar12 = *pbVar33;
            }
          }
LAB_0011b947:
          pbVar23 = pbVar23 + 1;
          *pbVar32 = bVar12;
          pbVar32 = pbVar32 + 1;
          local_290 = local_290 + 1;
          sVar15 = sVar15 + 1;
          goto LAB_0011b86e;
        }
        if (bVar12 == 0x5d) {
LAB_0011c1ad:
          pcVar16 = "unmatched close brace/bracket";
          pbVar33 = local_290;
          goto LAB_0011c1be;
        }
        if (bVar12 != 0x7b) {
          if (bVar12 != 0x7d) goto LAB_0011b947;
          goto LAB_0011c1ad;
        }
LAB_0011b961:
        if (sVar15 == 0) {
          CVar31 = CURLE_OK;
          if (*pbVar23 == 0x5b) {
            pbVar32 = pbVar23 + 1;
            pbVar33 = local_290 + 1;
            pUVar28 = glob_00->pattern + glob_00->size;
            glob_00->pattern[glob_00->size].globindex = local_274;
            local_274 = local_274 + 1;
            iVar13 = Curl_isalpha((uint)pbVar23[1]);
            if (iVar13 == 0) {
              iVar13 = Curl_isdigit((uint)*pbVar32);
              if (iVar13 != 0) {
                pUVar28->type = UPTNumRange;
                (pUVar28->content).NumRange.padlength = 0;
                if ((*pbVar32 == 0x30) && (iVar13 = Curl_isdigit(0x30), iVar13 != 0)) {
                  pbVar23 = pbVar23 + 2;
                  do {
                    piVar18 = &(pUVar28->content).NumRange.padlength;
                    *piVar18 = *piVar18 + 1;
                    iVar13 = Curl_isdigit((uint)*pbVar23);
                    pbVar23 = pbVar23 + 1;
                  } while (iVar13 != 0);
                }
                piVar18 = __errno_location();
                *piVar18 = 0;
                pbVar19 = (byte *)strtoul((char *)pbVar32,&endp,10);
                pbVar23 = pbVar32;
                if (((*piVar18 == 0) && ((byte *)endp != pbVar32)) &&
                   (pbVar8 = (byte *)endp, *endp == '-')) {
                  do {
                    do {
                      pbVar23 = pbVar8 + 1;
                      bVar12 = *pbVar23;
                      pbVar8 = pbVar23;
                    } while (bVar12 == 0x20);
                  } while (bVar12 == 9);
                  local_290 = pbVar19;
                  iVar13 = Curl_isdigit((uint)bVar12);
                  if (iVar13 == 0) goto LAB_0011bd85;
                  *piVar18 = 0;
                  paVar20 = (anon_union_40_3_e2f18bb4_for_content *)
                            strtoul((char *)pbVar23,&endp,10);
                  if (*piVar18 != 0) goto LAB_0011bd85;
                  if (*endp == ':') {
                    pbVar23 = (byte *)(endp + 1);
                    *piVar18 = 0;
                    local_268 = paVar20;
                    uVar34 = strtoul((char *)pbVar23,&endp,10);
                    if (((*piVar18 != 0) || (endp == (char *)0x0)) || (*endp != ']'))
                    goto LAB_0011bd85;
                    pbVar23 = (byte *)(endp + 1);
                    pbVar33 = pbVar33 + ((long)pbVar23 - (long)pbVar32);
                    if ((uVar34 != 0) &&
                       ((anon_union_40_3_e2f18bb4_for_content *)local_290 != local_268 ||
                        uVar34 == 1)) {
                      paVar20 = local_268;
                      if (local_268 != (anon_union_40_3_e2f18bb4_for_content *)local_290)
                      goto LAB_0011c110;
                      uVar21 = 0;
                      goto LAB_0011c135;
                    }
LAB_0011c16d:
                    pcVar16 = "bad range";
                  }
                  else {
                    if (*endp != ']') goto LAB_0011bd85;
                    pbVar23 = (byte *)(endp + 1);
                    pbVar33 = pbVar33 + ((long)pbVar23 - (long)pbVar32);
                    uVar34 = 1;
                    if (paVar20 == (anon_union_40_3_e2f18bb4_for_content *)local_290) {
                      uVar21 = 0;
                    }
                    else {
LAB_0011c110:
                      uVar21 = (long)paVar20 - (long)local_290;
                      if (paVar20 < local_290) goto LAB_0011c16d;
                      pcVar16 = "bad range";
                      if (uVar21 < uVar34) goto LAB_0011bd9a;
                    }
LAB_0011c135:
                    (pUVar28->content).NumRange.min_n = (unsigned_long)local_290;
                    (pUVar28->content).NumRange.ptr_n = (unsigned_long)local_290;
                    (pUVar28->content).NumRange.max_n = (unsigned_long)paVar20;
                    (pUVar28->content).NumRange.step = uVar34;
                    uVar34 = uVar21 / uVar34 + 1;
                    uVar11 = 0;
                    if ((uVar34 == 0) ||
                       (auVar4._8_8_ = 0, auVar4._0_8_ = uVar34, auVar7._8_8_ = 0,
                       auVar7._0_8_ = local_280, uVar11 = SUB168(auVar4 * auVar7,0),
                       SUB168(auVar4 * auVar7,8) == 0)) goto LAB_0011bea6;
                    pcVar16 = "range overflow";
                  }
                }
                else {
LAB_0011bd85:
                  pbVar33 = pbVar23 + ((long)pbVar33 - (long)pbVar32);
                  pcVar16 = "bad range";
                }
LAB_0011bd9a:
                glob_00->error = pcVar16;
                glob_00->pos = (size_t)pbVar33;
                CVar31 = CURLE_URL_MALFORMAT;
                pbVar23 = pbVar32;
                uVar11 = local_280;
                goto LAB_0011bea6;
              }
              glob_00->error = "bad range specification";
            }
            else {
              pUVar28->type = UPTCharRange;
              iVar13 = __isoc99_sscanf(pbVar32,"%c-%c%c",&min_c,&max_c,&end_c);
              if (iVar13 == 3) {
                if (end_c == ']') {
                  pbVar23 = pbVar23 + 5;
                  pbVar33 = local_290 + 5;
                  iVar27 = (int)min_c;
                  iVar13 = (int)max_c;
                  uVar34 = 1;
                  if (min_c == max_c) {
LAB_0011be34:
                    uVar14 = iVar13 - iVar27;
                    cVar26 = min_c;
LAB_0011be38:
                    (pUVar28->content).CharRange.step = (int)uVar34;
                    (pUVar28->content).CharRange.min_c = min_c;
                    (pUVar28->content).CharRange.ptr_c = min_c;
                    (pUVar28->content).CharRange.max_c = cVar26;
                    iVar13 = (int)uVar14 / (int)uVar34 + 1;
                    if (iVar13 == 0) {
                      local_280 = 0;
                      uVar11 = local_280;
                    }
                    else {
                      auVar3._8_8_ = 0;
                      auVar3._0_8_ = (long)iVar13;
                      auVar6._8_8_ = 0;
                      auVar6._0_8_ = local_280;
                      uVar11 = SUB168(auVar3 * auVar6,0);
                      if (SUB168(auVar3 * auVar6,8) != 0) {
                        pcVar16 = "range overflow";
                        goto LAB_0011bcf0;
                      }
                    }
                    goto LAB_0011bea6;
                  }
LAB_0011bf92:
                  if (min_c <= max_c) {
                    uVar14 = iVar13 - iVar27;
                    if ((int)uVar14 < 0x1a) {
                      pcVar16 = "bad range";
                      cVar26 = max_c;
                      if (uVar14 < uVar34) goto LAB_0011bcf0;
                      goto LAB_0011be38;
                    }
                  }
LAB_0011bf97:
                  pcVar16 = "bad range";
                }
                else {
                  if (end_c != ':') goto LAB_0011bce9;
                  piVar18 = __errno_location();
                  *piVar18 = 0;
                  uVar34 = strtoul((char *)(pbVar23 + 5),&endp,10);
                  if ((*piVar18 == 0) && (pbVar23 + 5 != (byte *)endp)) {
                    pbVar23 = (byte *)(endp + 1);
                    if (*endp != ']') {
                      pbVar23 = pbVar32;
                    }
                    pbVar33 = pbVar33 + ((long)pbVar23 - (long)pbVar32);
                    if (((*endp == ']') && (0xffffffff80000000 < uVar34 - 0x80000000)) &&
                       (uVar34 == 1 || min_c != max_c)) {
                      iVar27 = (int)min_c;
                      iVar13 = (int)max_c;
                      if (min_c == max_c) goto LAB_0011be34;
                      goto LAB_0011bf92;
                    }
                    goto LAB_0011bf97;
                  }
                  pcVar16 = "bad range";
                }
              }
              else {
LAB_0011bce9:
                pcVar16 = "bad range";
              }
LAB_0011bcf0:
              glob_00->error = pcVar16;
            }
            glob_00->pos = (size_t)pbVar33;
            CVar31 = CURLE_URL_MALFORMAT;
            pbVar23 = pbVar32;
            uVar11 = local_280;
          }
          else {
            pbVar33 = local_290;
            uVar11 = local_280;
            if (*pbVar23 == 0x7b) {
              local_270 = pbVar23 + 1;
              sVar1 = glob_00->size;
              pbVar32 = (byte *)glob_00->glob_buffer;
              pUVar28 = glob_00->pattern + sVar1;
              glob_00->pattern[sVar1].type = UPTSet;
              paVar30 = &glob_00->pattern[sVar1].content;
              paVar20 = &glob_00->pattern[sVar1].content;
              (paVar20->Set).elements = (char **)0x0;
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar20->Set + 8))->min_c = '\0';
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar20->Set + 8))->max_c = '\0';
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar20->Set + 8))->ptr_c = '\0';
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar20->Set + 8))->field_0x3 = 0;
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar20->Set + 8))->step = 0;
              glob_00->pattern[sVar1].globindex = local_274;
              local_274 = local_274 + 1;
              lVar25 = 1;
              pbVar19 = local_290;
              local_268 = paVar30;
              local_248 = pUVar28;
LAB_0011ba7b:
              pbVar33 = pbVar19 + 1;
              bVar12 = pbVar23[lVar25];
              if (bVar12 < 0x5c) {
                uVar11 = local_280;
                if (bVar12 != 0x2c) {
                  if (bVar12 != 0) {
                    if (bVar12 != 0x5b) goto LAB_0011bbb7;
LAB_0011bddc:
                    pcVar16 = "nested brace";
                    goto LAB_0011be8d;
                  }
                  glob_00->error = "unmatched brace";
                  glob_00->pos = (size_t)local_290;
                  goto LAB_0011be9b;
                }
LAB_0011bb06:
                local_280 = uVar11;
                *pbVar32 = 0;
                if ((paVar30->Set).elements == (char **)0x0) {
                  ppcVar17 = (char **)malloc(8);
                  (paVar30->Set).elements = ppcVar17;
                  if (ppcVar17 != (char **)0x0) goto LAB_0011bb53;
LAB_0011bdb3:
                  glob_00->error = "out of memory";
                  glob_00->pos = 0;
                  CVar31 = CURLE_OUT_OF_MEMORY;
                  pbVar23 = local_270;
                  uVar11 = local_280;
                  goto LAB_0011bea6;
                }
                ppcVar17 = (char **)realloc((paVar30->Set).elements,
                                            (long)(pUVar28->content).Set.size * 8 + 8);
                if (ppcVar17 == (char **)0x0) goto LAB_0011bdb3;
                (local_268->Set).elements = ppcVar17;
LAB_0011bb53:
                pcVar16 = strdup(glob_00->glob_buffer);
                iVar13 = (local_248->content).Set.size;
                ppcVar17[iVar13] = pcVar16;
                if (pcVar16 == (char *)0x0) goto LAB_0011bdb3;
                (local_248->content).Set.size = iVar13 + 1;
                if (pbVar23[lVar25] == 0x7d) {
                  pbVar23 = pbVar23 + lVar25 + 1;
                  goto LAB_0011b9f5;
                }
                pbVar32 = (byte *)glob_00->glob_buffer;
                pUVar28 = local_248;
                paVar30 = local_268;
                pbVar19 = pbVar33;
              }
              else {
                if (bVar12 < 0x7b) {
                  if (bVar12 == 0x5c) {
                    bVar12 = pbVar23[lVar25 + 1];
                    if (bVar12 == 0) {
                      bVar12 = 0x5c;
                    }
                    else {
                      lVar25 = lVar25 + 1;
                      pbVar33 = pbVar19 + 2;
                    }
                  }
                  else if (bVar12 == 0x5d) goto LAB_0011be7d;
                }
                else {
                  if (bVar12 == 0x7d) {
                    if (lVar25 == 1) {
                      pcVar16 = "empty string within braces";
                      goto LAB_0011be8d;
                    }
                    iVar13 = (pUVar28->content).Set.size + 1;
                    if (iVar13 == 0) {
                      local_280 = 0;
                      uVar11 = local_280;
                      goto LAB_0011bb06;
                    }
                    auVar2._8_8_ = 0;
                    auVar2._0_8_ = (long)iVar13;
                    auVar5._8_8_ = 0;
                    auVar5._0_8_ = local_280;
                    uVar11 = SUB168(auVar2 * auVar5,0);
                    if (SUB168(auVar2 * auVar5,8) != 0) {
                      glob_00->error = "range overflow";
                      glob_00->pos = 0;
                      goto LAB_0011be9b;
                    }
                    goto LAB_0011bb06;
                  }
                  if (bVar12 == 0x7b) goto LAB_0011bddc;
                }
LAB_0011bbb7:
                *pbVar32 = bVar12;
                pbVar32 = pbVar32 + 1;
                pbVar19 = pbVar33;
              }
              lVar25 = lVar25 + 1;
              goto LAB_0011ba7b;
            }
          }
        }
        else {
          *pbVar32 = 0;
          sVar1 = glob_00->size;
          pcVar16 = glob_00->glob_buffer;
          glob_00->pattern[sVar1].type = UPTSet;
          glob_00->pattern[sVar1].globindex = -1;
          glob_00->pattern[sVar1].content.NumRange.max_n = 1;
          ppcVar17 = (char **)malloc(8);
          glob_00->pattern[sVar1].content.Set.elements = ppcVar17;
          if (ppcVar17 == (char **)0x0) {
            glob_00->error = "out of memory";
            glob_00->pos = 0;
            CVar31 = CURLE_OUT_OF_MEMORY;
            pbVar33 = local_290;
            uVar11 = local_280;
          }
          else {
            __dest = (char *)malloc(sVar15 + 1);
            *ppcVar17 = __dest;
            if (__dest == (char *)0x0) {
              glob_00->error = "out of memory";
              glob_00->pos = 0;
              CVar31 = CURLE_OUT_OF_MEMORY;
              pbVar33 = local_290;
              uVar11 = local_280;
            }
            else {
              memcpy(__dest,pcVar16,sVar15);
              __dest[sVar15] = '\0';
              pbVar33 = local_290;
LAB_0011b9f5:
              CVar31 = CURLE_OK;
              uVar11 = local_280;
            }
          }
        }
        goto LAB_0011bea6;
      }
      if (CVar31 == CURLE_OK) {
        *local_258 = local_280;
        *local_240 = glob_00;
        return CURLE_OK;
      }
      goto LAB_0011c1dc;
    }
    free(pcVar16);
  }
  return CURLE_OUT_OF_MEMORY;
LAB_0011be7d:
  pcVar16 = "unexpected close bracket";
LAB_0011be8d:
  glob_00->error = pcVar16;
  glob_00->pos = (size_t)pbVar33;
LAB_0011be9b:
  CVar31 = CURLE_URL_MALFORMAT;
  pbVar23 = local_270;
  uVar11 = local_280;
LAB_0011bea6:
  local_280 = uVar11;
  uVar34 = glob_00->size + 1;
  glob_00->size = uVar34;
  if (99 < uVar34) {
    pcVar16 = "too many globs";
LAB_0011c1be:
    glob_00->error = pcVar16;
    glob_00->pos = (size_t)pbVar33;
    CVar31 = CURLE_URL_MALFORMAT;
LAB_0011c1dc:
    puVar10 = local_258;
    pFVar9 = local_260;
    if ((local_260 != (FILE *)0x0) && (ppcVar17 = (char **)glob_00->error, ppcVar17 != (char **)0x0)
       ) {
      sVar1 = glob_00->pos;
      ppcVar22 = ppcVar17;
      if (sVar1 != 0) {
        ppcVar22 = &endp;
        curl_msnprintf(ppcVar22,0x200,"%s in URL position %zu:\n%s\n%*s^",ppcVar17,sVar1,local_250,
                       sVar1 - 1," ");
      }
      curl_mfprintf(pFVar9,"curl: (%d) %s\n",CVar31,ppcVar22);
    }
    glob_cleanup(glob_00);
    *puVar10 = 1;
    return CVar31;
  }
  goto LAB_0011b84d;
}

Assistant:

CURLcode glob_url(URLGlob **glob, char *url, unsigned long *urlnum,
                  FILE *error)
{
  /*
   * We can deal with any-size, just make a buffer with the same length
   * as the specified URL!
   */
  URLGlob *glob_expand;
  unsigned long amount = 0;
  char *glob_buffer;
  CURLcode res;

  *glob = NULL;

  glob_buffer = malloc(strlen(url) + 1);
  if(!glob_buffer)
    return CURLE_OUT_OF_MEMORY;
  glob_buffer[0] = 0;

  glob_expand = calloc(1, sizeof(URLGlob));
  if(!glob_expand) {
    Curl_safefree(glob_buffer);
    return CURLE_OUT_OF_MEMORY;
  }
  glob_expand->urllen = strlen(url);
  glob_expand->glob_buffer = glob_buffer;

  res = glob_parse(glob_expand, url, 1, &amount);
  if(!res)
    *urlnum = amount;
  else {
    if(error && glob_expand->error) {
      char text[512];
      const char *t;
      if(glob_expand->pos) {
        msnprintf(text, sizeof(text), "%s in URL position %zu:\n%s\n%*s^",
                  glob_expand->error,
                  glob_expand->pos, url, glob_expand->pos - 1, " ");
        t = text;
      }
      else
        t = glob_expand->error;

      /* send error description to the error-stream */
      fprintf(error, "curl: (%d) %s\n", res, t);
    }
    /* it failed, we cleanup */
    glob_cleanup(glob_expand);
    *urlnum = 1;
    return res;
  }

  *glob = glob_expand;
  return CURLE_OK;
}